

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgToken.cpp
# Opt level: O2

void __thiscall rsg::Token::Token(Token *this,char *identifier)

{
  char *pcVar1;
  undefined8 *puVar2;
  
  this->m_type = IDENTIFIER;
  pcVar1 = deStrdup(identifier);
  (this->m_arg).identifier = pcVar1;
  if (pcVar1 != (char *)0x0) {
    return;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = strcpy;
  __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

Token::Token (const char* identifier)
	: m_type(IDENTIFIER)
{
	m_arg.identifier = deStrdup(identifier);
	if (!m_arg.identifier)
		throw std::bad_alloc();
}